

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::start_train_work(Solver *this)

{
  string *filename;
  bool bVar1;
  bool bVar2;
  int epoch;
  int stop_window;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  byte bVar6;
  string *filename_00;
  float fVar7;
  allocator local_d1;
  string local_d0;
  undefined4 local_ac;
  Timer timer;
  Trainer trainer;
  
  bVar1 = (this->hyper_param_).early_stop;
  epoch = (this->hyper_param_).num_epoch;
  stop_window = (this->hyper_param_).stop_window;
  bVar6 = (this->hyper_param_).cross_validation ^ 1;
  bVar2 = (this->hyper_param_).quiet;
  filename_00 = &(this->hyper_param_).model_file;
  iVar4 = std::__cxx11::string::compare((char *)filename_00);
  if ((iVar4 == 0) || (bVar3 = true, (this->hyper_param_).cross_validation == true)) {
    bVar3 = false;
  }
  filename = &(this->hyper_param_).txt_model_file;
  uVar5 = std::__cxx11::string::compare((char *)filename);
  if (((int)uVar5 == 0) ||
     (local_ac = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),1),
     (this->hyper_param_).cross_validation == true)) {
    local_ac = 0;
  }
  trainer.reader_list_.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  trainer.reader_list_.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  trainer.reader_list_.super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trainer.metric_info_.super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  trainer.metric_info_.super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  trainer.metric_info_.super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Trainer::Initialize(&trainer,&this->reader_,epoch,this->model_,this->loss_,this->metric_,
                      (bool)(bVar1 & bVar6),stop_window,(bool)(bVar6 & bVar2));
  std::__cxx11::string::string((string *)&local_d0,"Start to train ...",(allocator *)&timer);
  Color::print_action(&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if ((this->hyper_param_).cross_validation == true) {
    Trainer::CVTrain(&trainer);
    std::__cxx11::string::string((string *)&local_d0,"Finish Cross-Validation",(allocator *)&timer);
    Color::print_action(&local_d0);
  }
  else {
    Trainer::Train(&trainer);
    if (bVar3) {
      Timer::Timer(&timer);
      Timer::tic(&timer);
      std::__cxx11::string::string((string *)&local_d0,"Start to save model ...",&local_d1);
      Color::print_action(&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      Trainer::SaveModel(&trainer,filename_00);
      StringPrintf_abi_cxx11_(&local_d0,"Model file: %s",(filename_00->_M_dataplus)._M_p);
      Color::print_info(&local_d0,false);
      std::__cxx11::string::~string((string *)&local_d0);
      fVar7 = Timer::toc(&timer);
      StringPrintf_abi_cxx11_(&local_d0,"Time cost for saving model: %.2f (sec)",(double)fVar7);
      Color::print_info(&local_d0,false);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    if ((char)local_ac != '\0') {
      Timer::Timer(&timer);
      Timer::tic(&timer);
      std::__cxx11::string::string((string *)&local_d0,"Start to save txt model ...",&local_d1);
      Color::print_action(&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      Trainer::SaveTxtModel(&trainer,filename);
      StringPrintf_abi_cxx11_(&local_d0,"TXT Model file: %s",(filename->_M_dataplus)._M_p);
      Color::print_info(&local_d0,false);
      std::__cxx11::string::~string((string *)&local_d0);
      fVar7 = Timer::toc(&timer);
      StringPrintf_abi_cxx11_(&local_d0,"Time cost for saving txt model: %.2f (sec)",(double)fVar7);
      Color::print_info(&local_d0,false);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::__cxx11::string::string((string *)&local_d0,"Finish training",(allocator *)&timer);
    Color::print_action(&local_d0);
  }
  std::__cxx11::string::~string((string *)&local_d0);
  Trainer::~Trainer(&trainer);
  return;
}

Assistant:

void Solver::start_train_work() {
  int epoch = hyper_param_.num_epoch;
  bool early_stop = hyper_param_.early_stop &&
                   !hyper_param_.cross_validation;
  int stop_window = hyper_param_.stop_window;
  bool quiet = hyper_param_.quiet &&
              !hyper_param_.cross_validation;
  bool save_model = true;
  bool save_txt_model = true;
  if (hyper_param_.model_file.compare("none") == 0 ||
      hyper_param_.cross_validation) {
    save_model = false;
  }
  if (hyper_param_.txt_model_file.compare("none") == 0 ||
      hyper_param_.cross_validation) {
    save_txt_model = false;
  }
  Trainer trainer;
  trainer.Initialize(reader_,  /* Reader list */
                     epoch,
                     model_,
                     loss_,
                     metric_,
                     early_stop,
                     stop_window,
                     quiet);
  Color::print_action("Start to train ...");
/******************************************************************************
 * Training under cross-validation                                            *
 ******************************************************************************/
  if (hyper_param_.cross_validation) {
    trainer.CVTrain();
    Color::print_action("Finish Cross-Validation");
  } 
/******************************************************************************
 * Original training without cross-validation                                 *
 ******************************************************************************/
  else {
    // The training process
    trainer.Train();
    // Save binary model
    if (save_model) {
      Timer timer;
      timer.tic();
      Color::print_action("Start to save model ...");
      trainer.SaveModel(hyper_param_.model_file);
      Color::print_info(
        StringPrintf("Model file: %s", hyper_param_.model_file.c_str())
      );
      Color::print_info(
        StringPrintf("Time cost for saving model: %.2f (sec)", timer.toc())
      );
    }
    // Save TXT model 
    if (save_txt_model) {
      Timer timer;
      timer.tic();
      Color::print_action("Start to save txt model ...");
      trainer.SaveTxtModel(hyper_param_.txt_model_file);
      Color::print_info(
        StringPrintf("TXT Model file: %s", hyper_param_.txt_model_file.c_str())
      );
      Color::print_info(
        StringPrintf("Time cost for saving txt model: %.2f (sec)", timer.toc())
      );
    }
    Color::print_action("Finish training");
  }
}